

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.h
# Opt level: O2

UpdateType __thiscall
libDAI::Properties::FromStringTo<libDAI::LCLin::UpdateType>(Properties *this,PropertyKey *key)

{
  bool bVar1;
  bool bVar2;
  const_iterator cVar3;
  long *plVar4;
  type_info *this_00;
  UpdateType result;
  stringstream ss;
  UpdateType local_1d4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
                  *)this,key);
  this_00 = (type_info *)&void::typeinfo;
  bVar1 = true;
  if (*(long **)(cVar3._M_node + 2) != (long *)0x0) {
    plVar4 = (long *)(**(code **)(**(long **)(cVar3._M_node + 2) + 0x18))();
    if (plVar4 != (long *)0x0) {
      this_00 = (type_info *)(**(code **)(*plVar4 + 0x10))(plVar4);
      bVar1 = false;
      goto LAB_004f9031;
    }
  }
  plVar4 = (long *)0x0;
LAB_004f9031:
  bVar2 = std::type_info::operator!=(this_00,(type_info *)&LCLin::UpdateType::typeinfo);
  if (bVar2) {
    std::__cxx11::stringstream::stringstream(local_1b0);
    GetAs<std::__cxx11::string>(&local_1d0,this,key);
    std::operator<<(local_1a0,(string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    local_1d4.v = SEQFIX;
    operator>>((istream *)local_1b0,&local_1d4);
    std::__cxx11::stringstream::~stringstream(local_1b0);
  }
  else {
    local_1d4 = GetAs<libDAI::LCLin::UpdateType>(this,key);
  }
  if (!bVar1) {
    (**(code **)(*plVar4 + 8))(plVar4);
  }
  return (UpdateType)local_1d4.v;
}

Assistant:

ValueType FromStringTo(const PropertyKey &key) const { 
                PropertyValue val = Get(key);
                if( val.type() != typeid(ValueType) ) {
                    assert( val.type() == typeid(std::string) );

                    std::stringstream ss;
                    ss << GetAs<std::string>(key);
                    ValueType result;
                    ss >> result;

                    return result;
                } else
                    return GetAs<ValueType>(key);
            }